

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paladin.c
# Opt level: O2

void spell_rites_of_preparation(int sn,int level,CHAR_DATA *ch,void *vo,int target)

{
  CHAR_DATA *ach;
  PC_DATA *pPVar1;
  short sVar2;
  bool bVar3;
  bool bVar4;
  CHAR_DATA **ppCVar5;
  AFFECT_DATA af;
  
  sVar2 = (short)sn;
  bVar3 = is_affected(ch,sn);
  if (bVar3) {
    send_to_char("You cannot focus on preparing your party for battle again so soon.\n\r",ch);
    return;
  }
  bVar3 = false;
  ppCVar5 = &ch->in_room->people;
  while (ach = *ppCVar5, ach != (CHAR_DATA *)0x0) {
    bVar4 = is_same_group(ach,ch);
    if ((ach != ch) && (bVar4)) {
      bVar4 = is_same_group(ach,ch);
      bVar3 = true;
      if (bVar4) {
        bVar4 = is_npc(ach);
        if (!bVar4) {
          bVar4 = is_affected(ach,sn);
          if (!bVar4) {
            pPVar1 = ach->pcdata;
            pPVar1->condition[2] = 0;
            pPVar1->condition[3] = 0;
            init_affect(&af);
            af.where = 0;
            af.level = ch->level;
            af.modifier = af.level / 7;
            af.duration = 0x18;
            af.location = 0x12;
            af.type = sVar2;
            affect_to_char(ach,&af);
            af.level = ch->level;
            af.modifier = af.level / 7;
            af.duration = 0x18;
            af.location = 0x13;
            af.type = sVar2;
            affect_to_char(ach,&af);
            af.level = ch->level;
            af.modifier = af.level / -8;
            af.duration = 0x18;
            af.location = 0x14;
            af.aftype = 4;
            af.type = sVar2;
            affect_to_char(ach,&af);
          }
        }
      }
    }
    ppCVar5 = &ach->next_in_room;
  }
  if (bVar3) {
    act("You recite some prayers to those in your party, bolstering their confidence and preparing them for battle."
        ,ch,(void *)0x0,(void *)0x0,3);
    act("$n recites some prayers in a loud and confident voice, preparing you for righteous battle."
        ,ch,(void *)0x0,(void *)0x0,6);
    init_affect(&af);
    af.where = 0;
    af.aftype = 7;
    af.level = ch->level;
    af.modifier = 0;
    af.duration = 0x30;
    af.location = 0;
    af.type = sVar2;
    affect_to_char(ch,&af);
  }
  else {
    send_to_char("You need a party to perform these rites.\n\r",ch);
  }
  return;
}

Assistant:

void spell_rites_of_preparation(int sn, int level, CHAR_DATA *ch, void *vo, int target)
{
	CHAR_DATA *to;
	AFFECT_DATA af;
	bool hasgroup= false;

	if (is_affected(ch, sn))
	{
		send_to_char("You cannot focus on preparing your party for battle again so soon.\n\r", ch);
		return;
	}

	for (to = ch->in_room->people; to != nullptr; to = to->next_in_room)
	{
		if (is_same_group(to, ch) && to != ch)
			hasgroup = true;
		else
			continue;

		if (is_same_group(to, ch) && !is_npc(to) && !is_affected(to, sn))
		{
			to->pcdata->condition[COND_HUNGER] = 0;
			to->pcdata->condition[COND_THIRST] = 0;

			init_affect(&af);
			af.where = TO_AFFECTS;
			af.type = sn;
			af.modifier = (ch->level / 7);
			af.location = APPLY_HITROLL;
			af.duration = 24;
			af.level = ch->level;
			affect_to_char(to, &af);

			af.type = sn;
			af.modifier = (ch->level / 7);
			af.location = APPLY_DAMROLL;
			af.duration = 24;
			af.level = ch->level;
			affect_to_char(to, &af);

			af.type = sn;
			af.modifier = -(ch->level / 8);
			af.location = APPLY_SAVES;
			af.duration = 24;
			af.aftype = AFT_COMMUNE;
			af.level = ch->level;
			affect_to_char(to, &af);
		}
	}

	if (hasgroup == false)
	{
		send_to_char("You need a party to perform these rites.\n\r", ch);
		return;
	}
	else
	{
		act("You recite some prayers to those in your party, bolstering their confidence and preparing them for battle.", ch, 0, 0, TO_CHAR);
		act("$n recites some prayers in a loud and confident voice, preparing you for righteous battle.", ch, 0, 0, TO_GROUP);

		init_affect(&af);
		af.where = TO_AFFECTS;
		af.type = sn;
		af.aftype = AFT_TIMER;
		af.level = ch->level;
		af.location = APPLY_NONE;
		af.modifier = 0;
		af.duration = 48;
		affect_to_char(ch, &af);
	}
}